

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall client_socket::impl::~impl(impl *this)

{
  _Manager_type p_Var1;
  
  if (this->destroyed != (bool *)0x0) {
    *this->destroyed = true;
  }
  sysapi::epoll_registration::~epoll_registration(&this->reg);
  p_Var1 = (this->on_write_ready).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->on_write_ready,(_Any_data *)&this->on_write_ready,
              __destroy_functor);
  }
  p_Var1 = (this->on_read_ready).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->on_read_ready,(_Any_data *)&this->on_read_ready,__destroy_functor)
    ;
  }
  p_Var1 = (this->on_disconnect).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->on_disconnect,(_Any_data *)&this->on_disconnect,__destroy_functor)
    ;
  }
  file_descriptor::~file_descriptor(&this->fd);
  return;
}

Assistant:

client_socket::impl::~impl()
{
    if (destroyed)
        *destroyed = true;
}